

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas2.c
# Opt level: O2

int sp_cgemv(char *trans,singlecomplex alpha,SuperMatrix *A,singlecomplex *x,int incx,
            singlecomplex beta,singlecomplex *y,int incy)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  singlecomplex sVar7;
  singlecomplex sVar8;
  singlecomplex sVar9;
  singlecomplex sVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  singlecomplex *psVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  singlecomplex sVar32;
  char msg [256];
  
  fVar30 = beta.r;
  fVar28 = beta.i;
  fVar26 = alpha.r;
  fVar27 = alpha.i;
  bVar13 = *trans + 0xbd;
  if ((bVar13 < 0x2c) && ((0x80000020801U >> ((ulong)bVar13 & 0x3f) & 1) != 0)) {
    uVar24 = 0xffffffdfffe >> (bVar13 & 0x3f);
    uVar22 = A->nrow;
    if (-1 < (int)uVar22) {
      uVar2 = A->ncol;
      lVar14 = (long)(int)uVar2;
      if (-1 < lVar14) {
        if (incx == 0) {
          msg[0] = '\x05';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
        }
        else {
          if (incy != 0) {
            if (uVar2 == 0 || uVar22 == 0) {
              return 0;
            }
            pvVar5 = A->Store;
            lVar6 = *(long *)((long)pvVar5 + 8);
            if ((((fVar26 == 0.0 && fVar27 == 0.0) && (fVar30 == 1.0)) && (!NAN(fVar30))) &&
               ((fVar28 == 0.0 && (!NAN(fVar28))))) {
              return 0;
            }
            uVar11 = uVar2;
            if ((uVar24 & 1) == 0) {
              uVar11 = uVar22;
              uVar22 = uVar2;
            }
            uVar2 = (1 - uVar11) * incx;
            if (0 < incx) {
              uVar2 = 0;
            }
            uVar16 = (ulong)uVar2;
            uVar2 = (1 - uVar22) * incy;
            if (0 < incy) {
              uVar2 = 0;
            }
            lVar23 = (long)(int)uVar2;
            lVar19 = (long)incy;
            if (((fVar30 != 1.0) || (NAN(fVar30))) || ((fVar28 != 0.0 || (NAN(fVar28))))) {
              if (incy == 1) {
                if (fVar30 != 0.0 || fVar28 != 0.0) {
                  for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
                    sVar7.i = y[uVar20].r * fVar28 + y[uVar20].i * fVar30;
                    sVar7.r = y[uVar20].r * fVar30 + y[uVar20].i * -fVar28;
                    y[uVar20] = sVar7;
                  }
                }
                else {
                  for (uVar20 = 0; uVar22 != uVar20; uVar20 = uVar20 + 1) {
                    y[uVar20].r = 0.0;
                    y[uVar20].i = 0.0;
                  }
                }
              }
              else if (fVar30 != 0.0 || fVar28 != 0.0) {
                psVar21 = y + lVar23;
                while (bVar25 = uVar22 != 0, uVar22 = uVar22 - 1, bVar25) {
                  sVar8.i = psVar21->r * fVar28 + psVar21->i * fVar30;
                  sVar8.r = psVar21->r * fVar30 + psVar21->i * -fVar28;
                  *psVar21 = sVar8;
                  psVar21 = psVar21 + lVar19;
                }
              }
              else {
                psVar21 = y + lVar23;
                while (bVar25 = uVar22 != 0, uVar22 = uVar22 - 1, bVar25) {
                  psVar21->r = 0.0;
                  psVar21->i = 0.0;
                  psVar21 = psVar21 + lVar19;
                }
              }
            }
            if (fVar26 == 0.0 && fVar27 == 0.0) {
              return 0;
            }
            if ((uVar24 & 1) == 0) {
              if ((byte)(*trans | 0x20U) == 0x74) {
                if (incx == 1) {
                  lVar12 = (long)(int)uVar2;
                  lVar23 = *(long *)((long)pvVar5 + 0x18);
                  lVar18 = 0;
                  while (lVar18 != lVar14) {
                    lVar17 = lVar18 * 4;
                    lVar1 = lVar18 * 4;
                    lVar18 = lVar18 + 1;
                    fVar30 = 0.0;
                    fVar28 = 0.0;
                    for (lVar17 = (long)*(int *)(lVar23 + lVar17);
                        lVar17 < *(int *)(lVar23 + 4 + lVar1); lVar17 = lVar17 + 1) {
                      iVar3 = *(int *)(*(long *)((long)pvVar5 + 0x10) + lVar17 * 4);
                      uVar15 = *(undefined8 *)(lVar6 + lVar17 * 8);
                      fVar29 = (float)uVar15;
                      fVar31 = (float)((ulong)uVar15 >> 0x20);
                      fVar30 = fVar30 + x[iVar3].r * fVar29 + -fVar31 * x[iVar3].i;
                      fVar28 = fVar28 + x[iVar3].r * fVar31 + fVar29 * x[iVar3].i;
                    }
                    sVar9.i = y[lVar12].i + fVar30 * fVar27 + fVar28 * fVar26;
                    sVar9.r = y[lVar12].r + fVar30 * fVar26 + fVar28 * -fVar27;
                    y[lVar12] = sVar9;
                    lVar12 = lVar12 + lVar19;
                  }
                  return 0;
                }
                uVar15 = 0x23d;
              }
              else {
                if (incx == 1) {
                  lVar12 = *(long *)((long)pvVar5 + 0x18);
                  lVar18 = 0;
                  while (lVar18 != lVar14) {
                    lVar17 = lVar18 * 4;
                    lVar1 = lVar18 * 4;
                    lVar18 = lVar18 + 1;
                    fVar30 = 0.0;
                    fVar28 = 0.0;
                    for (lVar17 = (long)*(int *)(lVar12 + lVar17);
                        lVar17 < *(int *)(lVar12 + 4 + lVar1); lVar17 = lVar17 + 1) {
                      iVar3 = *(int *)(*(long *)((long)pvVar5 + 0x10) + lVar17 * 4);
                      uVar15 = *(undefined8 *)(lVar6 + lVar17 * 8);
                      fVar29 = (float)uVar15;
                      fVar31 = (float)((ulong)uVar15 >> 0x20);
                      fVar30 = fVar30 + x[iVar3].r * -fVar31 + x[iVar3].i * fVar29;
                      fVar28 = fVar28 + x[iVar3].r * fVar29 + x[iVar3].i * fVar31;
                    }
                    sVar10.i = y[lVar23].i + fVar28 * fVar27 + fVar30 * fVar26;
                    sVar10.r = y[lVar23].r + fVar28 * fVar26 + fVar30 * -fVar27;
                    y[lVar23] = sVar10;
                    lVar23 = lVar23 + lVar19;
                  }
                  return 0;
                }
                uVar15 = 0x252;
              }
            }
            else {
              if (incy == 1) {
                for (lVar19 = 0; lVar19 != lVar14; lVar19 = lVar19 + 1) {
                  fVar30 = x[uVar16].r;
                  fVar28 = x[uVar16].i;
                  if ((((fVar30 != 0.0) || (NAN(fVar30))) || (fVar28 != 0.0)) || (NAN(fVar28))) {
                    fVar29 = fVar30 * fVar26 + fVar28 * -fVar27;
                    fVar30 = fVar30 * fVar27 + fVar28 * fVar26;
                    iVar3 = *(int *)(*(long *)((long)pvVar5 + 0x18) + 4 + lVar19 * 4);
                    for (lVar23 = (long)*(int *)(*(long *)((long)pvVar5 + 0x18) + lVar19 * 4);
                        lVar23 < iVar3; lVar23 = lVar23 + 1) {
                      iVar4 = *(int *)(*(long *)((long)pvVar5 + 0x10) + lVar23 * 4);
                      fVar28 = *(float *)(lVar6 + lVar23 * 8);
                      fVar31 = *(float *)(lVar6 + 4 + lVar23 * 8);
                      sVar32.r = y[iVar4].r + fVar28 * fVar29 + fVar31 * -fVar30;
                      sVar32.i = y[iVar4].i + fVar28 * fVar30 + fVar31 * fVar29;
                      y[iVar4] = sVar32;
                    }
                  }
                  uVar16 = uVar16 + (long)incx;
                }
                return 0;
              }
              uVar15 = 0x22b;
            }
            sprintf(msg,"%s at line %d in file %s\n","Not implemented.",uVar15,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/csp_blas2.c"
                   );
            superlu_abort_and_exit(msg);
          }
          msg[0] = '\b';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
        }
        goto LAB_00110a38;
      }
    }
    msg[0] = '\x03';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
  }
  else {
    msg[0] = '\x01';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
  }
LAB_00110a38:
  input_error("sp_cgemv ",(int *)msg);
  return 0;
}

Assistant:

int
sp_cgemv(char *trans, singlecomplex alpha, SuperMatrix *A, singlecomplex *x, 
	 int incx, singlecomplex beta, singlecomplex *y, int incy)
{

    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int info;
    singlecomplex temp, temp1;
    int lenx, leny, i, j, irow;
    int iy, jx, jy, kx, ky;
    int notran;
    singlecomplex comp_zero = {0.0, 0.0};
    singlecomplex comp_one = {1.0, 0.0};

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0)
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_cgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if ( A->nrow == 0 || A->ncol == 0 || 
	 (c_eq(&alpha, &comp_zero) && c_eq(&beta, &comp_one)) )
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if ( notran ) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if ( !c_eq(&beta, &comp_one) ) {
	if (incy == 1) {
	    if ( c_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) y[i] = comp_zero;
	    else
		for (i = 0; i < leny; ++i) 
		  cc_mult(&y[i], &beta, &y[i]);
	} else {
	    iy = ky;
	    if ( c_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) {
		    y[iy] = comp_zero;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    cc_mult(&y[iy], &beta, &y[iy]);
		    iy += incy;
		}
	}
    }
    
    if ( c_eq(&alpha, &comp_zero) ) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if ( !c_eq(&x[jx], &comp_zero) ) {
		    cc_mult(&temp, &alpha, &x[jx]);
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			cc_mult(&temp1, &temp,  &Aval[i]);
			c_add(&y[irow], &y[irow], &temp1);
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else if (strncmp(trans, "T", 1) == 0 || strncmp(trans, "t", 1) == 0) {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    cc_mult(&temp1, &Aval[i], &x[irow]);
		    c_add(&temp, &temp, &temp1);
		}
		cc_mult(&temp1, &alpha, &temp);
		c_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else { /* trans == 'C' or 'c' */
	/* Form  y := alpha * conj(A) * x + y. */
	singlecomplex temp2;
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp2.r = Aval[i].r;
		    temp2.i = -Aval[i].i;  /* conjugation */
		    cc_mult(&temp1, &temp2, &x[irow]);
		    c_add(&temp, &temp, &temp1);
		}
		cc_mult(&temp1, &alpha, &temp);
		c_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;    
}